

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h.h
# Opt level: O2

void __thiscall
pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::TPZNodeRep
          (TPZNodeRep<4,_pztopology::TPZQuadrilateral> *this,
          TPZNodeRep<4,_pztopology::TPZQuadrilateral> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  key_type_conflict1 *__k;
  iterator iVar1;
  mapped_type_conflict *pmVar2;
  long lVar3;
  
  (this->super_TPZQuadrilateral).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNodeRep_016c36c0;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x20) {
      return;
    }
    __k = (key_type_conflict1 *)((long)cp->fNodeIndexes + lVar3);
    iVar1 = std::
            _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
            ::find(&gl2lcNdMap->_M_t,__k);
    if ((_Rb_tree_header *)iVar1._M_node == &(gl2lcNdMap->_M_t)._M_impl.super__Rb_tree_header)
    break;
    pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcNdMap,__k);
    *(mapped_type_conflict *)((long)this->fNodeIndexes + lVar3) = *pmVar2;
    lVar3 = lVar3 + 8;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h.h",
             0x2c);
}

Assistant:

TPZNodeRep<N,Topology>::TPZNodeRep(const TPZNodeRep<N,Topology> &cp, std::map<int64_t,int64_t> & gl2lcNdMap)
    : TPZRegisterClassId(&TPZNodeRep::ClassId)
	{
		int64_t i;
		for(i = 0; i < N; i++)
		{
			if (gl2lcNdMap.find(cp.fNodeIndexes[i]) == gl2lcNdMap.end())
            {
#ifdef PZ_LOG
                TPZLogger loggernoderep("pz.geom.noderep");
                if (loggernoderep.isErrorEnabled()) {
                  std::stringstream sout;
                  sout << "ERROR in - " << __PRETTY_FUNCTION__
                       << " trying to clone a node " << i << " index "
                       << cp.fNodeIndexes[i] << " which is not mapped";
                  LOGPZ_ERROR(loggernoderep, sout.str().c_str());
                }                                
#endif
				DebugStop();
			}
			fNodeIndexes[i] = gl2lcNdMap [ cp.fNodeIndexes[i] ];
		}
	}